

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseVarList(WastParser *this,VarVector *out_var_list)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13a;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  iterator local_118;
  size_type local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  Location local_f0;
  Var local_d0;
  Location local_88;
  undefined1 local_68 [8];
  Var var;
  VarVector *out_var_list_local;
  WastParser *this_local;
  
  var.field_2._24_8_ = out_var_list;
  Location::Location(&local_88);
  Var::Var((Var *)local_68,0xffffffff,&local_88);
  while( true ) {
    Location::Location(&local_f0);
    Var::Var(&local_d0,0xffffffff,&local_f0);
    bVar1 = ParseVarOpt(this,(Var *)local_68,&local_d0);
    Var::~Var(&local_d0);
    if (!bVar1) break;
    std::vector<wabt::Var,std::allocator<wabt::Var>>::emplace_back<wabt::Var&>
              ((vector<wabt::Var,std::allocator<wabt::Var>> *)var.field_2._24_8_,(Var *)local_68);
  }
  bVar1 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::empty
                    ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)var.field_2._24_8_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"a var",&local_139);
    local_118 = &local_138;
    local_110 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_13a);
    __l._M_len = local_110;
    __l._M_array = local_118;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,__l,&local_13a);
    this_local._4_4_ = ErrorExpected(this,&local_108,"12 or $foo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_13a);
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
    do {
      local_158 = local_158 + -1;
      std::__cxx11::string::~string((string *)local_158);
    } while (local_158 != &local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseVarList(VarVector* out_var_list) {
  WABT_TRACE(ParseVarList);
  Var var;
  while (ParseVarOpt(&var)) {
    out_var_list->emplace_back(var);
  }
  if (out_var_list->empty()) {
    return ErrorExpected({"a var"}, "12 or $foo");
  } else {
    return Result::Ok;
  }
}